

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-memory.c
# Opt level: O2

int run_test_get_memory(void)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_a = uv_get_free_memory();
  uVar1 = uv_get_total_memory();
  uVar2 = uv_get_constrained_memory();
  uVar3 = uv_get_available_memory();
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu, available_mem=%llu\n",eval_a,uVar1,
         uVar2,uVar3);
  eval_b = 0;
  if (eval_a < 1) {
    pcVar5 = ">";
    pcVar6 = "0";
    pcVar4 = "free_mem";
    uVar7 = 0x26;
  }
  else {
    eval_b = 0;
    if ((long)uVar1 < 1) {
      pcVar5 = ">";
      pcVar6 = "0";
      pcVar4 = "total_mem";
      uVar7 = 0x27;
      eval_a = uVar1;
    }
    else if (eval_a < (long)uVar1) {
      if ((long)uVar3 <= (long)uVar1) {
        return 0;
      }
      pcVar5 = "<=";
      pcVar6 = "total_mem";
      pcVar4 = "available_mem";
      uVar7 = 0x2e;
      eval_b = uVar1;
      eval_a = uVar3;
    }
    else {
      pcVar5 = ">";
      pcVar6 = "free_mem";
      pcVar4 = "total_mem";
      uVar7 = 0x2c;
      eval_b = eval_a;
      eval_a = uVar1;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-memory.c"
          ,uVar7,pcVar4,pcVar5,pcVar6,eval_a,pcVar5,eval_b);
  abort();
}

Assistant:

TEST_IMPL(get_memory) {
  uint64_t free_mem = uv_get_free_memory();
  uint64_t total_mem = uv_get_total_memory();
  uint64_t constrained_mem = uv_get_constrained_memory();
  uint64_t available_mem = uv_get_available_memory();

  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu, "
         "available_mem=%llu\n",
         (unsigned long long) free_mem,
         (unsigned long long) total_mem,
         (unsigned long long) constrained_mem,
         (unsigned long long) available_mem);

  ASSERT_GT(free_mem, 0);
  ASSERT_GT(total_mem, 0);
  /* On IBMi PASE, the amount of memory in use is always zero. */
#ifdef __PASE__
  ASSERT_EQ(total_mem, free_mem);
#else
  ASSERT_GT(total_mem, free_mem);
#endif
  ASSERT_LE(available_mem, total_mem);
  /* we'd really want to test if available <= free, but that is fragile:
   * with no limit set, get_available calls and returns get_free; so if
   * any memory was freed between our calls to get_free and get_available
   * we would fail such a test test (as observed on CI).
   */
  return 0;
}